

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

char * __thiscall google::protobuf::internal::LongSooRep::elements(LongSooRep *this)

{
  Nullable<const_char_*> failure_msg;
  char *ret;
  char *local_20;
  LogMessage local_18;
  
  local_20 = (char *)(this->elements_int & 0xfffffffffffffff8);
  local_18.errno_saver_.saved_errno_ = 0;
  local_18._4_4_ = 0;
  failure_msg = absl::lts_20250127::log_internal::Check_NEImpl<char*,decltype(nullptr)>
                          (&local_20,(void **)&local_18,"ret != nullptr");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    return local_20;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
             ,0x99,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_18);
}

Assistant:

char* elements() const {
    auto ret = reinterpret_cast<char*>(elements_int & kSooPtrMask);
    ABSL_DCHECK_NE(ret, nullptr);
    return ret;
  }